

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O2

int __thiscall
ExtraData::parseClipboardData
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int pos)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_58;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"                ClipboardData:      ");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,val);
  iVar1 = Utils::lenFourBytesFromPos
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,pos);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  poVar3 = std::operator<<((ostream *)&std::cout,"                     Size:          ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," bytes");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,
                           "The total size in bytes of the Format and Data fields, not including padding (if any)."
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"                     Format:        ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_58,val);
  iVar2 = Utils::lenFourBytesFromPos
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_58,pos + 4);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,
                           "An application-specific identifier for the format of the data in the Data field."
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_58);
  std::operator<<((ostream *)&std::cout,"                     Data:          ");
  Utils::print_vec_unicode_from_to(val,pos + 8,pos + iVar1 + -8);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,
                           "MUST be an array of bytes, followed by zero padding to a multiple of 4 bytes."
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  return iVar1 + 4;
}

Assistant:

int ExtraData::parseClipboardData(std::vector<unsigned int> val, int pos) {
    cout << "                ClipboardData:      " << endl;
    int len = Utils::lenFourBytesFromPos(val, pos);
    cout << "                     Size:          " << len << " bytes" << endl <<
         Utils::defaultOffsetDocInfo << "The total size in bytes of the Format and Data fields, not including padding (if any)." << endl;
    cout << "                     Format:        " << Utils::lenFourBytesFromPos(val, pos+4) << endl <<
         Utils::defaultOffsetDocInfo << "An application-specific identifier for the format of the data in the Data field." << endl;
    cout << "                     Data:          "; Utils::print_vec_unicode_from_to(val, pos+8, pos + len - 8);
    cout << Utils::defaultOffsetDocInfo << "MUST be an array of bytes, followed by zero padding to a multiple of 4 bytes." << endl;
    return len + 4;
}